

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O3

void __thiscall
ObjectFactorySystem::GetAll
          (ObjectFactorySystem *this,IAUDynArray<IObjectConstructor_*> *constructors)

{
  undefined8 *puVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  long lVar4;
  
  (*(code *)**(undefined8 **)constructors)
            (constructors,
             (long)(this->m_Constructors).
                   super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_Constructors).
                   super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppIVar2 = (this->m_Constructors).
            super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar3 = (this->m_Constructors).
            super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar3) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)((long)ppIVar2 + lVar4);
      *(undefined8 *)(*(long *)(constructors + 8) + lVar4) = *puVar1;
      lVar4 = lVar4 + 8;
    } while ((pointer)(puVar1 + 1) != ppIVar3);
  }
  return;
}

Assistant:

void ObjectFactorySystem::GetAll(IAUDynArray<IObjectConstructor*> &constructors) const
{
	constructors.Resize(m_Constructors.size());
	std::vector<IObjectConstructor*>::const_iterator it = m_Constructors.begin();
	std::vector<IObjectConstructor*>::const_iterator itEnd = m_Constructors.end();
	for(int i = 0; it != itEnd; ++it, ++i)
	{
		constructors[i] = *it;
	}
}